

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  ImVector<ImGuiPopupData> *this;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  
  pIVar2 = GImGui;
  if ((remaining < 0) || ((GImGui->OpenPopupStack).Size <= remaining)) {
    __assert_fail("remaining >= 0 && remaining < g.OpenPopupStack.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1f5b,"void ImGui::ClosePopupToLevel(int, bool)");
  }
  this = &GImGui->OpenPopupStack;
  pIVar3 = ImVector<ImGuiPopupData>::operator[](this,remaining);
  pIVar1 = pIVar3->SourceWindow;
  pIVar3 = ImVector<ImGuiPopupData>::operator[](this,remaining);
  pIVar4 = pIVar3->Window;
  ImVector<ImGuiPopupData>::resize(this,remaining);
  if (!restore_focus_to_window_under_popup) {
    return;
  }
  if (pIVar1 == (ImGuiWindow *)0x0) {
    pIVar4 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar1->WasActive == false) && (pIVar4 != (ImGuiWindow *)0x0)) {
      FocusTopMostWindowUnderOne(pIVar4,(ImGuiWindow *)0x0);
      return;
    }
    if (((pIVar2->NavLayer != ImGuiNavLayer_Main) ||
        (pIVar4 = pIVar1->NavLastChildNavWindow, pIVar4 == (ImGuiWindow *)0x0)) ||
       (pIVar4->WasActive == false)) {
      pIVar4 = pIVar1;
    }
  }
  FocusWindow(pIVar4);
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}